

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O2

TClusterToLetterMap *
Cipher::getNullCLMap(TClusterToLetterMap *__return_storage_ptr__,TClusters *clusters)

{
  _Rb_tree_header *p_Var1;
  pointer piVar2;
  mapped_type *pmVar3;
  int i;
  long lVar4;
  long lVar5;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar5 = 0;
  for (lVar4 = 0;
      piVar2 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      lVar4 < (int)((ulong)((long)(clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar2) >> 2);
      lVar4 = lVar4 + 1) {
    pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](__return_storage_ptr__,(key_type_conflict *)((long)piVar2 + lVar5));
    *pmVar3 = 0;
    lVar5 = lVar5 + 4;
  }
  return __return_storage_ptr__;
}

Assistant:

TClusterToLetterMap getNullCLMap(const TClusters & clusters) {
        TClusterToLetterMap result;

        for (int i = 0; i < (int) clusters.size(); ++i) {
            result[clusters[i]] = 0;
        }

        return result;
    }